

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSHelper.h
# Opt level: O2

void __thiscall Assimp::D3DS::Material::~Material(Material *this)

{
  ~Material(this);
  operator_delete(this,0x2b8);
  return;
}

Assistant:

virtual ~Material() {}